

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_mus.cpp
# Opt level: O3

bool midi_processor::process_mus
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,midi_container *p_out)

{
  const_iterator cVar1;
  byte bVar2;
  byte bVar3;
  pointer puVar4;
  midi_container *this;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  event_type p_type;
  bool bVar8;
  uint uVar9;
  size_t p_data_count;
  ulong uVar10;
  const_iterator end;
  uint uVar11;
  const_iterator it;
  midi_track track;
  uint8_t velocity_levels [16];
  byte local_b3;
  byte local_b2;
  const_iterator local_b0;
  midi_track local_a8;
  midi_event local_90;
  midi_container *local_50;
  byte local_48 [24];
  
  puVar4 = (p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (ulong)*(ushort *)(puVar4 + 4);
  uVar10 = (ulong)*(ushort *)(puVar4 + 6);
  midi_container::initialize(p_out,0,0x59);
  local_a8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  midi_event::midi_event(&local_90,0,extended,0,mus_default_tempo,5);
  midi_track::add_event(&local_a8,&local_90);
  if (local_90.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.m_ext_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  midi_event::midi_event(&local_90,0,extended,0,end_of_track,2);
  midi_track::add_event(&local_a8,&local_90);
  if (local_90.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.m_ext_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  midi_container::add_track(p_out,&local_a8);
  std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&local_a8.m_events);
  local_a8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[4] = 0;
  local_48[5] = 0;
  local_48[6] = 0;
  local_48[7] = 0;
  local_48[8] = 0;
  local_48[9] = 0;
  local_48[10] = 0;
  local_48[0xb] = 0;
  local_48[0xc] = 0;
  local_48[0xd] = 0;
  local_48[0xe] = 0;
  local_48[0xf] = 0;
  puVar4 = (p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar4;
  bVar8 = false;
  if ((uVar10 < uVar6) && (bVar8 = false, uVar10 + uVar7 <= uVar6)) {
    local_b0._M_current = puVar4 + uVar10;
    end._M_current = local_b0._M_current + uVar7;
    uVar11 = 0;
    local_50 = p_out;
    do {
      do {
        cVar1._M_current = local_b0._M_current;
        if (local_b0._M_current == end._M_current) {
LAB_00110b28:
          local_b0._M_current = cVar1._M_current;
          midi_event::midi_event(&local_90,(ulong)uVar11,extended,0,end_of_track,2);
          midi_track::add_event(&local_a8,&local_90);
          this = local_50;
          if (local_90.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_90.m_ext_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_90.m_ext_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_90.m_ext_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          bVar8 = true;
          midi_container::add_track(this,&local_a8);
          goto LAB_00110b84;
        }
        cVar1._M_current = local_b0._M_current + 1;
        bVar2 = *local_b0._M_current;
        if (bVar2 == 0x60) goto LAB_00110b28;
        uVar9 = bVar2 & 0xf;
        uVar7 = (ulong)((uVar9 + 1) - (uint)((byte)uVar9 < 9));
        if (uVar9 == 0xf) {
          uVar7 = 9;
        }
        switch(bVar2 >> 4 & 7) {
        case 0:
          if (cVar1._M_current != end._M_current) {
            local_b3 = local_b0._M_current[1];
            local_b2 = 0;
            local_b0._M_current = local_b0._M_current + 2;
            goto LAB_00110ac4;
          }
          goto switchD_00110964_default;
        case 1:
          if (cVar1._M_current == end._M_current) goto switchD_00110964_default;
          cVar1._M_current = local_b0._M_current + 2;
          local_b3 = local_b0._M_current[1];
          if ((char)local_b3 < '\0') {
            if (cVar1._M_current == end._M_current) goto switchD_00110964_default;
            local_b2 = local_b0._M_current[2];
            local_48[uVar7] = local_b2;
            local_b3 = local_b3 & 0x7f;
            local_b0._M_current = local_b0._M_current + 3;
          }
          else {
            local_b2 = local_48[uVar7];
            local_b0._M_current = cVar1._M_current;
          }
LAB_00110ac4:
          p_data_count = 2;
          p_type = note_on;
          break;
        case 2:
          if (cVar1._M_current == end._M_current) goto switchD_00110964_default;
          local_b2 = local_b0._M_current[1] >> 1;
          local_b3 = local_b0._M_current[1] << 7;
          p_data_count = 2;
          p_type = pitch_wheel;
          local_b0._M_current = local_b0._M_current + 2;
          break;
        case 3:
          if (cVar1._M_current == end._M_current) goto switchD_00110964_default;
          cVar1._M_current = local_b0._M_current + 2;
          if (4 < (byte)(local_b0._M_current[1] - 10)) goto switchD_00110964_default;
          local_b3 = ""[local_b0._M_current[1]];
          local_b2 = 1;
          local_b0._M_current = local_b0._M_current + 2;
LAB_00110a46:
          p_data_count = 2;
          p_type = control_change;
          break;
        case 4:
          if (cVar1._M_current == end._M_current) goto switchD_00110964_default;
          cVar1._M_current = local_b0._M_current + 2;
          bVar3 = local_b0._M_current[1];
          if ((ulong)bVar3 != 0) {
            if ((bVar3 < 10) && (local_b3 = ""[bVar3], cVar1._M_current != end._M_current)) {
              local_b2 = local_b0._M_current[2];
              local_b0._M_current = local_b0._M_current + 3;
              goto LAB_00110a46;
            }
            goto switchD_00110964_default;
          }
          if (cVar1._M_current == end._M_current) goto switchD_00110964_default;
          local_b3 = local_b0._M_current[2];
          p_data_count = 1;
          p_type = program_change;
          local_b0._M_current = local_b0._M_current + 3;
          break;
        default:
          goto switchD_00110964_default;
        }
        midi_event::midi_event(&local_90,(ulong)uVar11,p_type,(uint)uVar7,&local_b3,p_data_count);
        midi_track::add_event(&local_a8,&local_90);
        if (local_90.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_90.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_90.m_ext_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_90.m_ext_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      } while (-1 < (char)bVar2);
      iVar5 = decode_delta(&local_b0,end);
      uVar11 = uVar11 + iVar5;
      cVar1._M_current = local_b0._M_current;
    } while (-1 < iVar5);
switchD_00110964_default:
    local_b0._M_current = cVar1._M_current;
    bVar8 = false;
  }
LAB_00110b84:
  std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&local_a8.m_events);
  return bVar8;
}

Assistant:

bool midi_processor::process_mus( std::vector<uint8_t> const& p_file, midi_container & p_out )
{
    uint16_t length = p_file[ 4 ] | ( p_file[ 5 ] << 8 );
    uint16_t offset = p_file[ 6 ] | ( p_file[ 7 ] << 8 );

    p_out.initialize( 0, 0x59 );

    {
        midi_track track;
        track.add_event( midi_event( 0, midi_event::extended, 0, mus_default_tempo, _countof( mus_default_tempo ) ) );
        track.add_event( midi_event( 0, midi_event::extended, 0, end_of_track, _countof( end_of_track ) ) );
        p_out.add_track( track );
    }

    midi_track track;

    unsigned current_timestamp = 0;

    uint8_t velocity_levels[ 16 ] = { 0 };

    if ( (size_t)offset >= p_file.size() || (size_t)(offset + length) > p_file.size() )
        return false;

    std::vector<uint8_t>::const_iterator it = p_file.begin() + offset, end = p_file.begin() + offset + length;

    uint8_t buffer[ 4 ];

    while ( it != end )
    {
        buffer[ 0 ] = *it++;
        if ( buffer[ 0 ] == 0x60 ) break;

        midi_event::event_type type;

        unsigned bytes_to_write;

        unsigned channel = buffer[ 0 ] & 0x0F;
        if ( channel == 0x0F ) channel = 9;
        else if ( channel >= 9 ) ++channel;

        switch ( buffer[ 0 ] & 0x70 )
        {
        case 0x00:
            type = midi_event::note_on;
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            buffer[ 2 ] = 0;
            bytes_to_write = 2;
            break;

        case 0x10:
            type = midi_event::note_on;
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            if ( buffer[ 1 ] & 0x80 )
            {
                if ( it == end ) return false;
                buffer[ 2 ] = *it++;
                velocity_levels[ channel ] = buffer[ 2 ];
                buffer[ 1 ] &= 0x7F;
            }
            else
            {
                buffer[ 2 ] = velocity_levels[ channel ];
            }
            bytes_to_write = 2;
            break;

        case 0x20:
            type = midi_event::pitch_wheel;
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            buffer[ 2 ] = buffer[ 1 ] >> 1;
            buffer[ 1 ] <<= 7;
            bytes_to_write = 2;
            break;

        case 0x30:
            type = midi_event::control_change;
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            if ( buffer[ 1 ] >= 10 && buffer[ 1 ] <= 14 )
            {
                buffer[ 1 ] = mus_controllers[ buffer[ 1 ] ];
                buffer[ 2 ] = 1;
                bytes_to_write = 2;
            }
            else return false; /*throw exception_io_data( "Unhandled MUS system event" );*/
            break;

        case 0x40:
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            if ( buffer[ 1 ] )
            {
                if ( buffer[ 1 ] < 10 )
                {
                    type = midi_event::control_change;
                    buffer[ 1 ] = mus_controllers[ buffer[ 1 ] ];
                    if ( it == end ) return false;
                    buffer[ 2 ] = *it++;
                    bytes_to_write = 2;
                }
                else return false; /*throw exception_io_data( "Invalid MUS controller change event" );*/
            }
            else
            {
                type = midi_event::program_change;
                if ( it == end ) return false;
                buffer[ 1 ] = *it++;
                bytes_to_write = 1;
            }
            break;

        default:
            return false; /*throw exception_io_data( "Invalid MUS status code" );*/
        }

        track.add_event( midi_event( current_timestamp, type, channel, buffer + 1, bytes_to_write ) );

        if ( buffer[ 0 ] & 0x80 )
        {
            int delta = decode_delta( it, end );
            if ( delta < 0 ) return false; /*throw exception_io_data( "Invalid MUS delta" );*/
            current_timestamp += delta;
        }
    }

    track.add_event( midi_event( current_timestamp, midi_event::extended, 0, end_of_track, _countof( end_of_track ) ) );

    p_out.add_track( track );

    return true;
}